

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

bool __thiscall google::protobuf::internal::MapFieldBase::IsMapValid(MapFieldBase *this)

{
  State SVar1;
  
  SVar1 = state(this);
  return SVar1 != STATE_MODIFIED_REPEATED;
}

Assistant:

bool MapFieldBase::IsMapValid() const {
  ConstAccess();
  // "Acquire" insures the operation after SyncRepeatedFieldWithMap won't get
  // executed before state_ is checked.
  return state() != STATE_MODIFIED_REPEATED;
}